

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int MRIStepInnerStepper_Create(SUNContext sunctx,MRIStepInnerStepper *stepper)

{
  MRIStepInnerStepper p_Var1;
  MRIStepInnerStepper_Ops p_Var2;
  int iVar3;
  
  if (sunctx == (SUNContext)0x0) {
    iVar3 = -0x16;
  }
  else {
    p_Var1 = (MRIStepInnerStepper)calloc(1,0x60);
    *stepper = p_Var1;
    if (p_Var1 == (MRIStepInnerStepper)0x0) {
      iVar3 = -0x14;
      arkProcessError((ARKodeMem)0x0,-0x14,"ARKode::MRIStep","MRIStepInnerStepper_Create",
                      "Allocation of arkode_mem failed.");
    }
    else {
      p_Var2 = (MRIStepInnerStepper_Ops)calloc(1,0x18);
      p_Var1->ops = p_Var2;
      if (p_Var2 == (MRIStepInnerStepper_Ops)0x0) {
        iVar3 = -0x14;
        arkProcessError((ARKodeMem)0x0,-0x14,"ARKode::MRIStep","MRIStepInnerStepper_Create",
                        "Allocation of arkode_mem failed.");
        free(*stepper);
      }
      else {
        p_Var1->last_flag = 0;
        p_Var1->sunctx = sunctx;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int MRIStepInnerStepper_Create(SUNContext sunctx, MRIStepInnerStepper *stepper)
{
  if (!sunctx) return ARK_ILL_INPUT;

  *stepper = NULL;
  *stepper = (MRIStepInnerStepper) malloc(sizeof(**stepper));
  if (*stepper == NULL) {
    arkProcessError(NULL, ARK_MEM_FAIL, "ARKode::MRIStep",
                    "MRIStepInnerStepper_Create",
                    MSG_ARK_ARKMEM_FAIL);
    return(ARK_MEM_FAIL);
  }
  memset(*stepper, 0, sizeof(**stepper));

  (*stepper)->ops =
    (MRIStepInnerStepper_Ops) malloc(sizeof(*((*stepper)->ops)));
  if ((*stepper)->ops == NULL) {
    arkProcessError(NULL, ARK_MEM_FAIL, "ARKode::MRIStep",
                    "MRIStepInnerStepper_Create",
                    MSG_ARK_ARKMEM_FAIL);
    free(*stepper);
    return(ARK_MEM_FAIL);
  }
  memset((*stepper)->ops, 0, sizeof(*((*stepper)->ops)));

  /* initialize stepper data */
  (*stepper)->last_flag = ARK_SUCCESS;
  (*stepper)->sunctx    = sunctx;

  return(ARK_SUCCESS);
}